

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfloat.hpp
# Opt level: O2

mat4f * operator*(mat4f *__return_storage_ptr__,mat4f *a,mat4f *b)

{
  int i;
  long lVar1;
  float *pfVar2;
  int j;
  long lVar3;
  long lVar4;
  float fVar5;
  
  *(float *)((long)(__return_storage_ptr__->data + 3) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 3) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 3) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 2) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 2) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 2) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 2) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 1) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 1) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 1) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 1) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 0) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 0) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 0) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 0) + 0xc) = 0.0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    pfVar2 = (float *)b;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      fVar5 = __return_storage_ptr__->data[lVar1][lVar3];
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 4) {
        fVar5 = fVar5 + *(float *)((long)*(float (*) [4])*(float (*) [4])a + lVar4) * pfVar2[lVar4];
      }
      __return_storage_ptr__->data[lVar1][lVar3] = fVar5;
      pfVar2 = pfVar2 + 1;
    }
    a = (mat4f *)((long)a + 0x10);
  }
  return __return_storage_ptr__;
}

Assistant:

inline mat4f operator * (const mat4f& a, const mat4f& b)
{
	mat4f res;
	for (int i=0; i<4; ++i)
		for (int j=0; j<4; ++j)
			for (int k=0; k<4; ++k)
				res[i][j] += a[i][k] * b[k][j];
	return res;
}